

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

char * coda_identifier_from_name(char *name,hashtable *hash_data)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *name_00;
  char cVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  char *__s;
  
  __s = "unnamed";
  if (name != (char *)0x0) {
    while ((cVar3 = *name, __s = "unnamed", (long)cVar3 != 0 &&
           (ppuVar1 = __ctype_b_loc(), __s = name,
           (*(byte *)((long)*ppuVar1 + (long)cVar3 * 2 + 1) & 4) == 0))) {
      name = name + 1;
    }
  }
  sVar2 = strlen(__s);
  lVar6 = sVar2 << 0x20;
  name_00 = (char *)malloc(lVar6 + 0x500000000 >> 0x20);
  if (name_00 == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                   lVar6 + 0x400000000 >> 0x20,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0xac);
  }
  else {
    *name_00 = *__s;
    for (lVar5 = 1; lVar5 < (int)sVar2; lVar5 = lVar5 + 1) {
      ppuVar1 = __ctype_b_loc();
      cVar3 = '_';
      if (((*ppuVar1)[__s[lVar5]] & 8) != 0) {
        cVar3 = __s[lVar5];
      }
      name_00[lVar5] = cVar3;
    }
    name_00[lVar6 >> 0x20] = '\0';
    if (hash_data != (hashtable *)0x0) {
      uVar4 = 1;
      while (lVar5 = coda_hashtable_get_index_from_name(hash_data,name_00), -1 < lVar5) {
        if (uVar4 == 1000) {
          __assert_fail("counter < 1000",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                        ,0xcb,"char *coda_identifier_from_name(const char *, hashtable *)");
        }
        sprintf(name_00 + (lVar6 >> 0x20),"_%d",(ulong)uVar4);
        uVar4 = uVar4 + 1;
      }
    }
  }
  return name_00;
}

Assistant:

char *coda_identifier_from_name(const char *name, hashtable *hash_data)
{
    const int postfix_length = 4;
    char *identifier;
    int length;
    int i;

    if (name == NULL)
    {
        name = "unnamed";
    }
    else
    {
        /* strip leading non-alpha characters */
        while (*name != '\0' && !isalpha(*name))
        {
            name++;
        }
        if (*name == '\0')
        {
            name = "unnamed";
        }
    }

    length = (int)strlen(name);
    /* allow some space for _### postfixes */
    identifier = malloc(length + postfix_length + 1);
    if (identifier == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(length + postfix_length), __FILE__, __LINE__);
        return NULL;
    }

    /* create identifier */

    /* first character is guaranteed to be an alpha character because of our previous test */
    identifier[0] = name[0];
    /* replace non-alphanumeric characters by a '_' */
    for (i = 1; i < length; i++)
    {
        if (isalnum(name[i]))
        {
            identifier[i] = name[i];
        }
        else
        {
            identifier[i] = '_';
        }
    }
    identifier[length] = '\0';

    /* check for double occurrences */
    if (hash_data != NULL)
    {
        int counter;

        counter = 0;
        while (hashtable_get_index_from_name(hash_data, identifier) >= 0)
        {
            counter++;
            assert(counter < 1000);
            sprintf(&identifier[length], "_%d", counter);
        }
    }

    return identifier;
}